

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

Bond_p __thiscall indigox::Molecule::GetBond(Molecule *this,Atom_p *a,Atom_p *b)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined8 uVar3;
  AtomBondIterator AVar4;
  AtomBondIterator AVar5;
  long *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Bond_p BVar6;
  Bond_p bnd;
  undefined1 local_68 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._24_8_ = (element_type *)0x0;
  Atom::GetMolecule((Atom *)local_68);
  peVar1 = *(element_type **)local_68._0_8_;
  peVar2 = (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  if (peVar1 == peVar2) {
    Atom::GetMolecule((Atom *)local_68);
    peVar1 = *(element_type **)local_68._0_8_;
    peVar2 = (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    if (peVar1 == peVar2) {
      AVar4 = Atom::BeginBond((b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
      local_68._32_8_ = &this->super_enable_shared_from_this<indigox::Molecule>;
      while( true ) {
        AVar5 = Atom::EndBond((b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
        if (AVar4._M_current == AVar5._M_current) break;
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,AVar4._M_current)
        ;
        Bond::GetSourceAtom((Bond *)local_68);
        if ((element_type *)local_68._0_8_ ==
            (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
          Bond::GetTargetAtom((Bond *)(local_68 + 0x28));
          uVar3 = local_68._40_8_;
          peVar1 = (element_type *)*in_RCX;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
          if ((element_type *)uVar3 == peVar1) goto LAB_0010a1f2;
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
        }
        Bond::GetSourceAtom((Bond *)local_68);
        if ((element_type *)local_68._0_8_ == (element_type *)*in_RCX) {
          Bond::GetTargetAtom((Bond *)(local_68 + 0x28));
          uVar3 = local_68._40_8_;
          peVar1 = (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
          if ((element_type *)uVar3 == peVar1) goto LAB_0010a1f2;
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_);
        AVar4._M_current = AVar4._M_current + 1;
      }
    }
  }
  uVar3 = local_68._24_8_;
  local_68._24_8_ = (element_type *)0x0;
  (this->super_CountableObject<indigox::Molecule>).id_ = local_68._16_8_;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar3;
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0010a1f2:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
  BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Bond_p)BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::GetBond(Atom_p a, Atom_p b) const {
  /// @todo Logging system calls for fail reasons
  Bond_p bnd = Bond_p();
  if (a->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  if (b->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  for (AtomBondIterator it = a->BeginBond(); it != a->EndBond(); ++it) {
    Bond_p tmp = it->lock();
    if (tmp->GetSourceAtom() == a && tmp->GetTargetAtom() == b) return tmp;
    if (tmp->GetSourceAtom() == b && tmp->GetTargetAtom() == a) return tmp;
  }
  return bnd;
}